

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O1

void write_to_register(ymz280b_state *chip,UINT8 data)

{
  byte bVar1;
  UINT8 UVar2;
  uint uVar3;
  _func_void_void_ptr_UINT8 *UNRECOVERED_JUMPTABLE;
  long lVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  ushort uVar9;
  char *format;
  void *pvVar10;
  
  bVar8 = chip->current_register;
  uVar6 = (uint)bVar8;
  if ((char)bVar8 < '\0') {
    switch(bVar8) {
    case 0x80:
    case 0x81:
    case 0x82:
      format = "DSP register write %02X = %02X\n";
      goto LAB_0015a18b;
    case 0x84:
      chip->ext_mem_address_hi = (uint)data << 0x10;
      break;
    case 0x85:
      chip->ext_mem_address_mid = (uint)data << 8;
      break;
    case 0x86:
      uVar6 = (uint)data | chip->ext_mem_address_hi | chip->ext_mem_address_mid;
      chip->ext_mem_address = uVar6;
      if (chip->ext_mem_enable != '\0') {
        uVar6 = uVar6 & 0xffffff;
        if (uVar6 < chip->mem_size) {
          UVar2 = chip->mem_base[uVar6];
        }
        else {
          UVar2 = '\0';
        }
        chip->ext_readlatch = UVar2;
      }
      break;
    case 0x87:
      if (chip->ext_mem_enable != '\0') {
        if (chip->ext_write_handler != (_func_void_void_ptr_UINT32_UINT8 *)0x0) {
          (*chip->ext_write_handler)(chip->ext_param,chip->ext_mem_address,data);
        }
        chip->ext_mem_address = chip->ext_mem_address + 1 & 0xffffff;
      }
      break;
    default:
      if (uVar6 == 0xfe) {
        chip->irq_mask = data;
        if ((chip->irq_enable == '\0') || ((data & chip->status_register) == 0)) {
          if (chip->irq_state == '\0') {
            return;
          }
          chip->irq_state = '\0';
          UNRECOVERED_JUMPTABLE = chip->irq_handler;
          if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr_UINT8 *)0x0) {
            return;
          }
          pvVar10 = chip->irq_param;
          UVar2 = '\0';
        }
        else {
          if (chip->irq_state != '\0') {
            return;
          }
          chip->irq_state = '\x01';
          UNRECOVERED_JUMPTABLE = chip->irq_handler;
          if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr_UINT8 *)0x0) {
            return;
          }
          pvVar10 = chip->irq_param;
          UVar2 = '\x01';
        }
        (*UNRECOVERED_JUMPTABLE)(pvVar10,UVar2);
        return;
      }
      if (uVar6 == 0xff) {
        chip->ext_mem_enable = data >> 6 & 1;
        bVar8 = data >> 4 & 1;
        chip->irq_enable = bVar8;
        if ((bVar8 == 0) || ((chip->irq_mask & chip->status_register) == 0)) {
          if (chip->irq_state == '\0') goto LAB_0015a493;
          chip->irq_state = '\0';
          UNRECOVERED_JUMPTABLE = chip->irq_handler;
          if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr_UINT8 *)0x0) goto LAB_0015a493;
          pvVar10 = chip->irq_param;
          UVar2 = '\0';
        }
        else {
          if (chip->irq_state != '\0') goto LAB_0015a493;
          chip->irq_state = '\x01';
          UNRECOVERED_JUMPTABLE = chip->irq_handler;
          if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr_UINT8 *)0x0) goto LAB_0015a493;
          pvVar10 = chip->irq_param;
          UVar2 = '\x01';
        }
        (*UNRECOVERED_JUMPTABLE)(pvVar10,UVar2);
LAB_0015a493:
        if ((char)data < '\0' || chip->keyon_enable == '\0') {
          if (chip->keyon_enable == '\0' && (char)data < '\0') {
            lVar4 = 0x23;
            do {
              if ((*(char *)((long)chip->voice + lVar4 + -0x21) != '\0') &&
                 (*(char *)((long)chip->voice + lVar4 + -0x20) != '\0')) {
                *(undefined1 *)((long)chip->voice + lVar4 + -0x23) = 1;
              }
              lVar4 = lVar4 + 0x4c;
            } while (lVar4 != 0x283);
          }
        }
        else {
          lVar4 = 0x68;
          do {
            *(undefined1 *)((long)chip->voice + lVar4 + -0x68) = 0;
            *(undefined1 *)((long)chip->voice + lVar4 + -0x20) = 0;
            lVar4 = lVar4 + 0x4c;
          } while (lVar4 != 0x2c8);
        }
        chip->keyon_enable = data >> 7;
        return;
      }
    case 0x83:
      format = "unknown register write %02X = %02X\n";
LAB_0015a18b:
      emu_logf(&chip->logger,'\x04',format,(ulong)bVar8,data);
      return;
    }
  }
  else {
    uVar3 = bVar8 >> 2 & 7;
    uVar6 = uVar6 & 99;
    if (0x3f < uVar6) {
      switch(uVar6) {
      case 0x40:
        chip->voice[uVar3].start = (uint)data << 9 | chip->voice[uVar3].start & 0x1fe01fe;
        return;
      case 0x41:
        chip->voice[uVar3].loop_start = (uint)data << 9 | chip->voice[uVar3].loop_start & 0x1fe01fe;
        return;
      case 0x42:
        chip->voice[uVar3].loop_end = (uint)data << 9 | chip->voice[uVar3].loop_end & 0x1fe01fe;
        return;
      case 0x43:
        chip->voice[uVar3].stop = (uint)data << 9 | chip->voice[uVar3].stop & 0x1fe01fe;
        return;
      default:
        (*(code *)(&DAT_0017bc08 + *(int *)(&DAT_0017bc08 + (ulong)(uVar6 - 0x60) * 4)))();
        return;
      }
    }
    switch(uVar6) {
    case 0:
      uVar5 = chip->voice[uVar3].fnum & 0x100 | (ushort)data;
      chip->voice[uVar3].fnum = uVar5;
      if (chip->voice[uVar3].mode == '\x01') {
        uVar5 = (ushort)data;
      }
      break;
    case 1:
      uVar9 = (ushort)(byte)chip->voice[uVar3].fnum;
      uVar5 = (data & 1) << 8 | uVar9;
      chip->voice[uVar3].fnum = uVar5;
      chip->voice[uVar3].looping = data >> 4 & 1;
      if ((data & 0x60) == 0) {
        data = data & 0x1f;
      }
      else {
        chip->voice[uVar3].mode = (data & 0x60) >> 5;
      }
      UVar2 = chip->voice[uVar3].keyon;
      if ((((char)data < '\0') && (UVar2 == '\0')) && (chip->keyon_enable != '\0')) {
        chip->voice[uVar3].playing = '\x01';
        chip->voice[uVar3].position = chip->voice[uVar3].start;
        chip->voice[uVar3].loop_signal = 0;
        chip->voice[uVar3].signal = 0;
        chip->voice[uVar3].step = 0x7f;
        chip->voice[uVar3].loop_step = 0x7f;
        chip->voice[uVar3].loop_count = 0;
LAB_0015a556:
        chip->voice[uVar3].irq_schedule = '\0';
      }
      else if ((-1 < (char)data) && (UVar2 != '\0')) {
        chip->voice[uVar3].playing = '\0';
        goto LAB_0015a556;
      }
      chip->voice[uVar3].keyon = data >> 7;
      if (chip->voice[uVar3].mode == '\x01') {
        uVar5 = uVar9;
      }
      break;
    case 2:
      chip->voice[uVar3].level = data;
      bVar8 = chip->voice[uVar3].pan;
      if (bVar8 != 8) {
        uVar6 = (uint)data;
        if (bVar8 < 8) {
LAB_0015a418:
          chip->voice[uVar3].output_left = uVar6;
          if (bVar8 == 0) {
            uVar6 = 0;
          }
          else {
            uVar6 = ((bVar8 - 1) * uVar6) / 7;
          }
          chip->voice[uVar3].output_right = uVar6;
          return;
        }
        uVar7 = (int)((0xf - (uint)bVar8) * uVar6) / 7;
LAB_0015a5b7:
        chip->voice[uVar3].output_left = uVar7;
        chip->voice[uVar3].output_right = uVar6;
        return;
      }
      uVar6 = (uint)data;
      goto LAB_0015a236;
    case 3:
      bVar8 = data & 0xf;
      chip->voice[uVar3].pan = bVar8;
      if (bVar8 != 8) {
        bVar1 = chip->voice[uVar3].level;
        uVar6 = (uint)bVar1;
        if (bVar8 < 8) goto LAB_0015a418;
        uVar7 = ((bVar8 ^ 0xf) * uVar6) / 7;
        uVar6 = (uint)bVar1;
        goto LAB_0015a5b7;
      }
      uVar6 = (uint)chip->voice[uVar3].level;
LAB_0015a236:
      chip->voice[uVar3].output_left = uVar6;
      chip->voice[uVar3].output_right = uVar6;
      return;
    default:
      (*(code *)(&DAT_0017bbe8 + *(int *)(&DAT_0017bbe8 + (ulong)(uVar6 - 0x20) * 4)))();
      return;
    }
    chip->voice[uVar3].output_step =
         (INT32)(long)(((double)(ushort)(uVar5 + 1) * chip->master_clock * 0.00390625 * 16384.0) /
                      chip->rate);
  }
  return;
}

Assistant:

static void write_to_register(ymz280b_state *chip, UINT8 data)
{
	struct YMZ280BVoice *voice;
	int i;

	/* lower registers follow a pattern */
	if (chip->current_register < 0x80)
	{
		voice = &chip->voice[(chip->current_register >> 2) & 7];

		switch (chip->current_register & 0xe3)
		{
			case 0x00:      /* pitch low 8 bits */
				voice->fnum = (voice->fnum & 0x100) | (data & 0xff);
				update_step(chip, voice);
				break;

			case 0x01:      /* pitch upper 1 bit, loop, key on, mode */
				voice->fnum = (voice->fnum & 0xff) | ((data & 0x01) << 8);
				voice->looping = (data & 0x10) >> 4;
				if ((data & 0x60) == 0) data &= 0x7f; /* ignore mode setting and set to same state as KON=0 */
				else voice->mode = (data & 0x60) >> 5;
				if (!voice->keyon && (data & 0x80) && chip->keyon_enable)
				{
					voice->playing = 1;
					voice->position = voice->start;
					voice->signal = voice->loop_signal = 0;
					voice->step = voice->loop_step = 0x7f;
					voice->loop_count = 0;

					/* if update_irq_state_timer is set, cancel it. */
					voice->irq_schedule = 0;
				}
				else if (voice->keyon && !(data & 0x80))
				{
					voice->playing = 0;

					// if update_irq_state_timer is set, cancel it.
					voice->irq_schedule = 0;
				}
				voice->keyon = (data & 0x80) >> 7;
				update_step(chip, voice);
				break;

			case 0x02:      /* total level */
				voice->level = data;
				update_volumes(voice);
				break;

			case 0x03:      /* pan */
				voice->pan = data & 0x0f;
				update_volumes(voice);
				break;

			case 0x20:      /* start address high */
				voice->start = (voice->start & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x21:      /* loop start address high */
				voice->loop_start = (voice->loop_start & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x22:      /* loop end address high */
				voice->loop_end = (voice->loop_end & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x23:      /* stop address high */
				voice->stop = (voice->stop & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x40:      /* start address middle */
				voice->start = (voice->start & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x41:      /* loop start address middle */
				voice->loop_start = (voice->loop_start & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x42:      /* loop end address middle */
				voice->loop_end = (voice->loop_end & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x43:      /* stop address middle */
				voice->stop = (voice->stop & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x60:      /* start address low */
				voice->start = (voice->start & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x61:      /* loop start address low */
				voice->loop_start = (voice->loop_start & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x62:      /* loop end address low */
				voice->loop_end = (voice->loop_end & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x63:      /* stop address low */
				voice->stop = (voice->stop & (0xffff00 << 1)) | (data << 1);
				break;

			default:
				emu_logf(&chip->logger, DEVLOG_DEBUG, "unknown register write %02X = %02X\n", chip->current_register, data);
				break;
		}
	}

	/* upper registers are special */
	else
	{
		switch (chip->current_register)
		{
			/* DSP related (not implemented yet) */
			case 0x80: // d0-2: DSP Rch, d3: enable Rch (0: yes, 1: no), d4-6: DSP Lch, d7: enable Lch (0: yes, 1: no)
			case 0x81: // d0: enable control of $82 (0: yes, 1: no)
			case 0x82: // DSP data
				emu_logf(&chip->logger, DEVLOG_DEBUG, "DSP register write %02X = %02X\n", chip->current_register, data);
				break;

			case 0x84:      /* ROM readback / RAM write (high) */
				chip->ext_mem_address_hi = data << 16;
				break;

			case 0x85:      /* ROM readback / RAM write (middle) */
				chip->ext_mem_address_mid = data << 8;
				break;

			case 0x86:      /* ROM readback / RAM write (low) -> update latch */
				chip->ext_mem_address = chip->ext_mem_address_hi | chip->ext_mem_address_mid | data;
				if (chip->ext_mem_enable)
					chip->ext_readlatch = ymz280b_read_memory(chip, chip->ext_mem_address);
				break;

			case 0x87:      /* RAM write */
				if (chip->ext_mem_enable)
				{
					if (chip->ext_write_handler != NULL)
						chip->ext_write_handler(chip->ext_param, chip->ext_mem_address, data);
					//else
					//	emu_logf(&chip->logger, DEVLOG_TRACE, "attempted RAM write to %X\n", chip->ext_mem_address);
					chip->ext_mem_address = (chip->ext_mem_address + 1) & 0xffffff;
				}
				break;

			case 0xfe:      /* IRQ mask */
				chip->irq_mask = data;
				update_irq_state(chip);
				break;

			case 0xff:      /* IRQ enable, test, etc */
				chip->ext_mem_enable = (data & 0x40) >> 6;
				chip->irq_enable = (data & 0x10) >> 4;
				update_irq_state(chip);

				if (chip->keyon_enable && !(data & 0x80))
				{
					for (i = 0; i < 8; i++)
					{
						chip->voice[i].playing = 0;

						/* if update_irq_state_timer is set, cancel it. */
						chip->voice[i].irq_schedule = 0;
					}
				}
				else if (!chip->keyon_enable && (data & 0x80))
				{
					for (i = 0; i < 8; i++)
					{
						if (chip->voice[i].keyon && chip->voice[i].looping)
							chip->voice[i].playing = 1;
					}
				}
				chip->keyon_enable = (data & 0x80) >> 7;
				break;

			default:
				emu_logf(&chip->logger, DEVLOG_DEBUG, "unknown register write %02X = %02X\n", chip->current_register, data);
				break;
		}
	}
}